

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::makefacetverticesmap(tetgenmesh *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  verttype vVar4;
  arraypool *this_00;
  arraypool *paVar5;
  ulong uVar6;
  int *piVar7;
  point *ppdVar8;
  uint local_88;
  uint local_84;
  int k;
  int j;
  int i;
  int totalvertices;
  int facetindex;
  verttype vt;
  point *parypt;
  point *ppt;
  point pa;
  face *parysh1;
  face *parysh;
  face neighsh;
  face subloop;
  arraypool **paryvertlist;
  arraypool *vertlist;
  arraypool *facetvertexlist;
  tetgenmesh *this_local;
  
  face::face((face *)&neighsh.shver);
  face::face((face *)&parysh);
  if (this->b->verbose != 0) {
    printf("  Creating the facet vertices map.\n");
  }
  this_00 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_00,8,10);
  j = 0;
  i = 0;
  memorypool::traversalinit(this->subfaces);
  neighsh._8_8_ = shellfacetraverse(this,this->subfaces);
  while (neighsh._8_8_ != 0) {
    bVar3 = sinfected(this,(face *)&neighsh.shver);
    if (!bVar3) {
      paVar5 = (arraypool *)operator_new(0x30);
      arraypool::arraypool(paVar5,8,8);
      parypt = (point *)(neighsh._8_8_ + 0x18);
      for (local_88 = 0; (int)local_88 < 3; local_88 = local_88 + 1) {
        vVar4 = pointtype(this,parypt[(int)local_88]);
        if ((vVar4 != FREESEGVERTEX) && (vVar4 != FREEFACETVERTEX)) {
          pinfect(this,parypt[(int)local_88]);
          arraypool::newindex(paVar5,(void **)&facetindex);
          *(point *)_facetindex = parypt[(int)local_88];
        }
      }
      sinfect(this,(face *)&neighsh.shver);
      arraypool::newindex(this->caveshlist,&parysh1);
      face::operator=(parysh1,(face *)&neighsh.shver);
      for (k = 0; (long)k < this->caveshlist->objects; k = k + 1) {
        parysh1 = (face *)(this->caveshlist->toparray
                           [k >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
                          (k & this->caveshlist->objectsperblockmark) *
                          this->caveshlist->objectbytes);
        setfacetindex(this,parysh1,i);
        for (local_84 = 0; (int)local_84 < 3; local_84 = local_84 + 1) {
          if (parysh1->sh[(parysh1->shver >> 1) + 6] == (shellface)0x0) {
            spivot(this,parysh1,(face *)&parysh);
            bVar3 = sinfected(this,(face *)&parysh);
            if (!bVar3) {
              ppt = (point *)sapex(this,(face *)&parysh);
              bVar3 = pinfected(this,(point)ppt);
              if (((!bVar3) && (vVar4 = pointtype(this,(point)ppt), vVar4 != FREESEGVERTEX)) &&
                 (vVar4 != FREEFACETVERTEX)) {
                pinfect(this,(point)ppt);
                arraypool::newindex(paVar5,(void **)&facetindex);
                *(point **)_facetindex = ppt;
              }
              sinfect(this,(face *)&parysh);
              arraypool::newindex(this->caveshlist,&pa);
              face::operator=((face *)pa,(face *)&parysh);
            }
          }
          senextself(this,parysh1);
        }
      }
      j = (int)paVar5->objects + j;
      for (local_88 = 0; (long)(int)local_88 < paVar5->objects; local_88 = local_88 + 1) {
        _facetindex = paVar5->toparray[(int)local_88 >> ((byte)paVar5->log2objectsperblock & 0x1f)]
                      + (int)((local_88 & paVar5->objectsperblockmark) * paVar5->objectbytes);
        puninfect(this,*(point *)_facetindex);
      }
      arraypool::restart(this->caveshlist);
      arraypool::newindex(this_00,(void **)&subloop.shver);
      *(arraypool **)subloop._8_8_ = paVar5;
      i = i + 1;
    }
    neighsh._8_8_ = shellfacetraverse(this,this->subfaces);
  }
  memorypool::traversalinit(this->subfaces);
  neighsh._8_8_ = shellfacetraverse(this,this->subfaces);
  while (neighsh._8_8_ != 0) {
    suninfect(this,(face *)&neighsh.shver);
    neighsh._8_8_ = shellfacetraverse(this,this->subfaces);
  }
  if (this->b->verbose != 0) {
    printf("  Found %ld facets.\n",this_00->objects);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(i + 1);
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar7 = (int *)operator_new__(uVar6);
  this->idx2facetlist = piVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)j;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppdVar8 = (point *)operator_new__(uVar6);
  this->facetverticeslist = ppdVar8;
  this->totalworkmemory = (long)(i + 1) * 4 + (long)j * 8 + this->totalworkmemory;
  *this->idx2facetlist = 0;
  local_88 = 0;
  for (k = 0; k < i; k = k + 1) {
    subloop._8_8_ =
         this_00->toparray[k >> ((byte)this_00->log2objectsperblock & 0x1f)] +
         (k & this_00->objectsperblockmark) * this_00->objectbytes;
    piVar7 = *(int **)subloop._8_8_;
    this->idx2facetlist[k + 1] = this->idx2facetlist[k] + (int)*(undefined8 *)(piVar7 + 8);
    for (local_84 = 0; (long)(int)local_84 < *(long *)(piVar7 + 8); local_84 = local_84 + 1) {
      _facetindex = (char *)(*(long *)(*(long *)(piVar7 + 6) +
                                      (long)((int)local_84 >> ((byte)piVar7[2] & 0x1f)) * 8) +
                            (long)(int)((local_84 & piVar7[3]) * *piVar7));
      this->facetverticeslist[(int)local_88] = *(point *)_facetindex;
      local_88 = local_88 + 1;
    }
  }
  for (k = 0; (long)k < this_00->objects; k = k + 1) {
    subloop._8_8_ =
         this_00->toparray[k >> ((byte)this_00->log2objectsperblock & 0x1f)] +
         (k & this_00->objectsperblockmark) * this_00->objectbytes;
    paVar5 = *(arraypool **)subloop._8_8_;
    if (paVar5 != (arraypool *)0x0) {
      arraypool::~arraypool(paVar5);
      operator_delete(paVar5,0x30);
    }
  }
  if (this_00 != (arraypool *)0x0) {
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  return;
}

Assistant:

void tetgenmesh::makefacetverticesmap()
{
  arraypool *facetvertexlist, *vertlist, **paryvertlist;
  face subloop, neighsh, *parysh, *parysh1;
  point pa, *ppt, *parypt;
  verttype vt;
  int facetindex, totalvertices;
  int i, j, k;

  if (b->verbose) {
    printf("  Creating the facet vertices map.\n");
  }

  facetvertexlist = new arraypool(sizeof(arraypool *), 10);
  facetindex = totalvertices = 0;

  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    if (!sinfected(subloop)) {
      // A new facet. Create its vertices list.
      vertlist = new arraypool(sizeof(point *), 8);
      ppt = (point *) &(subloop.sh[3]);
      for (k = 0; k < 3; k++) {
        vt = pointtype(ppt[k]);
        if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
          pinfect(ppt[k]);
          vertlist->newindex((void **) &parypt);
          *parypt = ppt[k];
        }
      }
      sinfect(subloop);
      caveshlist->newindex((void **) &parysh);
      *parysh = subloop;
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        setfacetindex(*parysh, facetindex);
        for (j = 0; j < 3; j++) {
          if (!isshsubseg(*parysh)) {
            spivot(*parysh, neighsh);
            if (!sinfected(neighsh)) {
              pa = sapex(neighsh);
              if (!pinfected(pa)) {
                vt = pointtype(pa);
                if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
                  pinfect(pa);
                  vertlist->newindex((void **) &parypt);
                  *parypt = pa;
                }
              }
              sinfect(neighsh);
              caveshlist->newindex((void **) &parysh1);
              *parysh1 = neighsh;
            }
          }
          senextself(*parysh);
        }
      } // i
      totalvertices += (int) vertlist->objects;
      // Uninfect facet vertices.
      for (k = 0; k < vertlist->objects; k++) {
        parypt = (point *) fastlookup(vertlist, k);
        puninfect(*parypt);
      }
      caveshlist->restart();
      // Save this vertex list.
      facetvertexlist->newindex((void **) &paryvertlist);
      *paryvertlist = vertlist;
      facetindex++;
    } 
    subloop.sh = shellfacetraverse(subfaces);
  }

  // All subfaces are infected. Uninfect them.
  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    suninfect(subloop);
    subloop.sh = shellfacetraverse(subfaces);
  }

  if (b->verbose) {
    printf("  Found %ld facets.\n", facetvertexlist->objects);
  }

  idx2facetlist = new int[facetindex + 1];
  facetverticeslist = new point[totalvertices];

  totalworkmemory += ((facetindex + 1) * sizeof(int) + 
                      totalvertices * sizeof(point *));

  idx2facetlist[0] = 0;
  for (i = 0, k = 0; i < facetindex; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    idx2facetlist[i + 1] = (idx2facetlist[i] + (int) vertlist->objects);
    for (j = 0; j < vertlist->objects; j++) {
      parypt = (point *) fastlookup(vertlist, j);
      facetverticeslist[k] = *parypt;
      k++;
    }
  }

  // Free the lists.
  for (i = 0; i < facetvertexlist->objects; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    delete vertlist;
  }
  delete facetvertexlist;
}